

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::TypeofFld_Internal
              (Var instance,bool isRoot,PropertyId propertyId,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  JavascriptString *pJVar5;
  PropertyRecord *pPVar6;
  undefined4 *puVar7;
  undefined1 local_48 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  RecyclableObject *object;
  Var value;
  
  pJVar5 = (JavascriptString *)(ulong)(uint)propertyId;
  autoCatchHandlerExists.m_threadContext = (ThreadContext *)0x0;
  BVar3 = GetPropertyObject(instance,scriptContext,
                            (RecyclableObject **)&autoCatchHandlerExists.m_threadContext);
  if (BVar3 == 0) {
    pPVar6 = ScriptContext::GetPropertyName(scriptContext,propertyId);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,(PCWSTR)(pPVar6 + 1));
  }
  object = (RecyclableObject *)0x0;
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_48,scriptContext,true);
  if (isRoot) {
    iVar4 = GetRootProperty(instance,propertyId,&object,scriptContext,(PropertyValueInfo *)0x0);
  }
  else {
    iVar4 = GetProperty(instance,(RecyclableObject *)autoCatchHandlerExists.m_threadContext,
                        propertyId,&object,scriptContext,(PropertyValueInfo *)0x0);
  }
  if (iVar4 == 0) {
    pJVar5 = StringCache::GetUndefinedDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    if (&((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
         )->super_RecyclableObject == object) {
      bVar2 = true;
      goto LAB_00995aec;
    }
    pJVar5 = (JavascriptString *)Typeof(object,scriptContext);
  }
  bVar2 = false;
LAB_00995aec:
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_48);
  if (!bVar2) {
    return pJVar5;
  }
  if (&((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr)
       ->super_RecyclableObject != object) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x189,"(scriptContext->IsUndeclBlockVar(value))",
                                "scriptContext->IsUndeclBlockVar(value)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
}

Assistant:

Var JavascriptOperators::TypeofFld_Internal(Var instance, const bool isRoot, PropertyId propertyId, ScriptContext* scriptContext)
    {
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined , scriptContext->GetPropertyName(propertyId)->GetBuffer());
        }

        Var value = nullptr;
        try
        {
            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);

            // In edge mode, spec compat is more important than backward compat. Use spec/web behavior here
            if (isRoot
                    ? !JavascriptOperators::GetRootProperty(instance, propertyId, &value, scriptContext)
                    : !JavascriptOperators::GetProperty(instance, object, propertyId, &value, scriptContext))
            {
                return scriptContext->GetLibrary()->GetUndefinedDisplayString();
            }
            if (!scriptContext->IsUndeclBlockVar(value))
            {
                return JavascriptOperators::Typeof(value, scriptContext);
            }
        }
        catch(const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }

        Assert(scriptContext->IsUndeclBlockVar(value));
        JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
    }